

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O0

void QOpenGL2PaintEngineExPrivate::cleanupVectorPath(QPaintEngineEx *engine,void *data)

{
  undefined8 *in_RSI;
  QOpenGL2PEVectorPathCache *c;
  
  free((void *)*in_RSI);
  free((void *)in_RSI[1]);
  if (in_RSI != (undefined8 *)0x0) {
    operator_delete(in_RSI,0x30);
  }
  return;
}

Assistant:

void QOpenGL2PaintEngineExPrivate::cleanupVectorPath(QPaintEngineEx *engine, void *data)
{
    QOpenGL2PEVectorPathCache *c = (QOpenGL2PEVectorPathCache *) data;
#ifdef QT_OPENGL_CACHE_AS_VBOS
    Q_ASSERT(engine->type() == QPaintEngine::OpenGL2);
    static_cast<QOpenGL2PaintEngineEx *>(engine)->d_func()->unusedVBOSToClean << c->vbo;
    if (c->ibo)
        d->unusedIBOSToClean << c->ibo;
#else
    Q_UNUSED(engine);
    free(c->vertices);
    free(c->indices);
#endif
    delete c;
}